

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_dispatch.c
# Opt level: O2

mpt_dispatch * mpt_notify_dispatch(mpt_notify *no)

{
  mpt_event_handler_t p_Var1;
  mpt_dispatch *disp;
  
  disp = (mpt_dispatch *)malloc(0x28);
  if (disp != (mpt_dispatch *)0x0) {
    p_Var1 = (no->_disp).cmd;
    if (p_Var1 != (mpt_event_handler_t)0x0) {
      (*p_Var1)((no->_disp).arg,(mpt_event *)0x0);
      (no->_disp).cmd = (mpt_event_handler_t)0x0;
    }
    mpt_dispatch_init(disp);
    (no->_disp).cmd = dispatchEvent;
    (no->_disp).arg = disp;
  }
  return disp;
}

Assistant:

extern MPT_STRUCT(dispatch) *mpt_notify_dispatch(MPT_STRUCT(notify) *no)
{
	MPT_STRUCT(dispatch) *disp;
	
	if (!(disp = malloc(sizeof(*disp)))) {
		return 0;
	}
	if (no->_disp.cmd) {
		no->_disp.cmd(no->_disp.arg, 0);
		no->_disp.cmd = 0;
	}
	mpt_dispatch_init(disp);
	no->_disp.cmd = dispatchEvent;
	no->_disp.arg = disp;
	
	return disp;
}